

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UniqueNameGenerator.cpp
# Opt level: O0

void __thiscall
Assimp::MDL::HalfLife::UniqueNameGenerator::make_unique
          (UniqueNameGenerator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *names)

{
  value_type_conflict7 vVar1;
  __type _Var2;
  bool bVar3;
  size_type sVar4;
  reference pvVar5;
  long lVar6;
  size_type sVar7;
  mapped_type *this_00;
  pointer ppVar8;
  reference puVar9;
  reference puVar10;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DuplicateInfo>_>,_bool>
  pVar11;
  __type local_221;
  string local_210;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_1f0;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_1e8;
  iterator it_2;
  size_t i_1;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_1b8;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_1b0;
  iterator it_1;
  _Self local_188;
  _Self local_180;
  iterator it2;
  _Self local_170;
  iterator it;
  DuplicateInfo local_158;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DuplicateInfo>
  local_138;
  byte local_f1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  value_type_conflict7 local_d0;
  size_t i;
  anon_class_24_3_9cb0d701 generate_unique_name;
  anon_class_8_1_8991fb9c format_name;
  undefined1 local_98 [8];
  string template_name_with_separator;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DuplicateInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DuplicateInfo>_>_>
  names_to_duplicates;
  vector<unsigned_long,_std::allocator<unsigned_long>_> template_name_duplicates;
  vector<unsigned_long,_std::allocator<unsigned_long>_> empty_names_indices;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *names_local;
  UniqueNameGenerator *this_local;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             &template_name_duplicates.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             &names_to_duplicates._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DuplicateInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DuplicateInfo>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DuplicateInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DuplicateInfo>_>_>
         *)((long)&template_name_with_separator.field_2 + 8));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                 &this->template_name_,&this->separator_);
  i = (long)&template_name_with_separator.field_2 + 8;
  generate_unique_name.names_to_duplicates =
       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DuplicateInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DuplicateInfo>_>_>
        *)&generate_unique_name.names;
  generate_unique_name.format_name = (anon_class_8_1_8991fb9c *)names;
  generate_unique_name.names =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)this;
  for (local_d0 = 0; vVar1 = local_d0,
      sVar4 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(names), vVar1 < sVar4; local_d0 = local_d0 + 1) {
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](names,local_d0);
    lVar6 = std::__cxx11::string::find_first_not_of((char)pvVar5,0x20);
    if (lVar6 == -1) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 &template_name_duplicates.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,&local_d0);
    }
    else {
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](names,local_d0);
      _Var2 = std::operator==(pvVar5,&this->template_name_);
      local_f1 = 0;
      local_221 = true;
      if (!_Var2) {
        pvVar5 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](names,local_d0);
        std::__cxx11::string::length();
        std::__cxx11::string::substr((ulong)&local_f0,(ulong)pvVar5);
        local_f1 = 1;
        local_221 = std::operator==(&local_f0,
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_98);
      }
      if ((local_f1 & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_f0);
      }
      if (local_221 != false) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   &names_to_duplicates._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_d0);
      }
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](names,local_d0);
      sVar7 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DuplicateInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DuplicateInfo>_>_>
              ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DuplicateInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DuplicateInfo>_>_>
                       *)((long)&template_name_with_separator.field_2 + 8),pvVar5);
      if (sVar7 == 0) {
        pvVar5 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](names,local_d0);
        make_unique::DuplicateInfo::DuplicateInfo(&local_158);
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DuplicateInfo>
        ::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_DuplicateInfo,_true>
                  (&local_138,pvVar5,&local_158);
        pVar11 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DuplicateInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DuplicateInfo>_>_>
                 ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DuplicateInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DuplicateInfo>_>_>
                           *)((long)&template_name_with_separator.field_2 + 8),&local_138);
        it._M_node = (_Base_ptr)pVar11.first._M_node;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DuplicateInfo>
        ::~pair(&local_138);
        make_unique::DuplicateInfo::~DuplicateInfo(&local_158);
      }
      else {
        pvVar5 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](names,local_d0);
        this_00 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DuplicateInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DuplicateInfo>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DuplicateInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DuplicateInfo>_>_>
                                *)((long)&template_name_with_separator.field_2 + 8),pvVar5);
        std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  (&this_00->indices,&local_d0);
      }
    }
  }
  local_170._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DuplicateInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DuplicateInfo>_>_>
       ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DuplicateInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DuplicateInfo>_>_>
                *)((long)&template_name_with_separator.field_2 + 8));
  while( true ) {
    it2._M_node = (_List_node_base *)
                  std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DuplicateInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DuplicateInfo>_>_>
                  ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DuplicateInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DuplicateInfo>_>_>
                         *)((long)&template_name_with_separator.field_2 + 8));
    bVar3 = std::operator!=(&local_170,(_Self *)&it2);
    if (!bVar3) break;
    ppVar8 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DuplicateInfo>_>
             ::operator->(&local_170);
    local_180._M_node =
         (_List_node_base *)
         std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::begin
                   (&(ppVar8->second).indices);
    while( true ) {
      ppVar8 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DuplicateInfo>_>
               ::operator->(&local_170);
      local_188._M_node =
           (_List_node_base *)
           std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::end
                     (&(ppVar8->second).indices);
      bVar3 = std::operator!=(&local_180,&local_188);
      if (!bVar3) break;
      ppVar8 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DuplicateInfo>_>
               ::operator->(&local_170);
      make_unique(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_0::
      operator()::string_const___const((string *)&it_1,&i,&ppVar8->first);
      puVar9 = std::_List_iterator<unsigned_long>::operator*(&local_180);
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](names,*puVar9);
      std::__cxx11::string::operator=((string *)pvVar5,(string *)&it_1);
      std::__cxx11::string::~string((string *)&it_1);
      std::_List_iterator<unsigned_long>::operator++(&local_180);
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DuplicateInfo>_>
    ::operator++(&local_170);
  }
  sVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     &names_to_duplicates._M_t._M_impl.super__Rb_tree_header._M_node_count);
  if (sVar4 == 0) {
    it_2._M_current = (unsigned_long *)0x0;
    local_1e8._M_current =
         (unsigned_long *)
         std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                   ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                    &template_name_duplicates.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
    while( true ) {
      local_1f0._M_current =
           (unsigned_long *)
           std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                      &template_name_duplicates.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
      bVar3 = __gnu_cxx::operator!=(&local_1e8,&local_1f0);
      if (!bVar3) break;
      make_unique(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_1::
      operator()::string_const__unsigned_long__const
                (&local_210,&generate_unique_name.names,&this->template_name_,
                 (size_t)it_2._M_current);
      puVar10 = __gnu_cxx::
                __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                ::operator*(&local_1e8);
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](names,*puVar10);
      std::__cxx11::string::operator=((string *)pvVar5,(string *)&local_210);
      std::__cxx11::string::~string((string *)&local_210);
      __gnu_cxx::
      __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++(&local_1e8);
      it_2._M_current = it_2._M_current + 1;
    }
  }
  else {
    local_1b0._M_current =
         (unsigned_long *)
         std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                   ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                    &template_name_duplicates.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
    while( true ) {
      local_1b8._M_current =
           (unsigned_long *)
           std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                      &template_name_duplicates.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
      bVar3 = __gnu_cxx::operator!=(&local_1b0,&local_1b8);
      if (!bVar3) break;
      make_unique(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_0::
      operator()::string_const___const((string *)&i_1,&i,&this->template_name_);
      puVar10 = __gnu_cxx::
                __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                ::operator*(&local_1b0);
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](names,*puVar10);
      std::__cxx11::string::operator=((string *)pvVar5,(string *)&i_1);
      std::__cxx11::string::~string((string *)&i_1);
      __gnu_cxx::
      __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++(&local_1b0);
    }
  }
  std::__cxx11::string::~string((string *)local_98);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DuplicateInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DuplicateInfo>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DuplicateInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DuplicateInfo>_>_>
          *)((long)&template_name_with_separator.field_2 + 8));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             &names_to_duplicates._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             &template_name_duplicates.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void UniqueNameGenerator::make_unique(std::vector<std::string> &names) {
    struct DuplicateInfo {
        DuplicateInfo() :
            indices(),
            next_id(0) {
        }

        std::list<size_t> indices;
        size_t next_id;
    };

    std::vector<size_t> empty_names_indices;
    std::vector<size_t> template_name_duplicates;
    std::map<std::string, DuplicateInfo> names_to_duplicates;

    const std::string template_name_with_separator(template_name_ + separator_);

    auto format_name = [&](const std::string &base_name, size_t id) -> std::string {
        return base_name + separator_ + std::to_string(id);
    };

    auto generate_unique_name = [&](const std::string &base_name) -> std::string {
        auto *duplicate_info = &names_to_duplicates[base_name];

        std::string new_name = "";

        bool found_identical_name;
        bool tried_with_base_name_only = false;
        do {
            // Assume that no identical name exists.
            found_identical_name = false;

            if (!tried_with_base_name_only) {
                // First try with only the base name.
                new_name = base_name;
            } else {
                // Create the name expected to be unique.
                new_name = format_name(base_name, duplicate_info->next_id);
            }

            // Check in the list of duplicates for an identical name.
            for (size_t i = 0;
                    i < names.size() &&
                    !found_identical_name;
                    ++i) {
                if (new_name == names[i])
                    found_identical_name = true;
            }

            if (tried_with_base_name_only)
                ++duplicate_info->next_id;

            tried_with_base_name_only = true;

        } while (found_identical_name);

        return new_name;
    };

    for (size_t i = 0; i < names.size(); ++i) {
        // Check for empty names.
        if (names[i].find_first_not_of(' ') == std::string::npos) {
            empty_names_indices.push_back(i);
            continue;
        }

        /* Check for potential duplicate.
        a) Either if this name is the same as the template name or
        b) <template name><separator> is found at the beginning. */
        if (names[i] == template_name_ ||
                names[i].substr(0, template_name_with_separator.length()) == template_name_with_separator)
            template_name_duplicates.push_back(i);

        // Map each unique name to it's duplicate.
        if (names_to_duplicates.count(names[i]) == 0)
            names_to_duplicates.insert({ names[i], DuplicateInfo()});
        else
            names_to_duplicates[names[i]].indices.push_back(i);
    }

    // Make every non-empty name unique.
    for (auto it = names_to_duplicates.begin();
            it != names_to_duplicates.end(); ++it) {
        for (auto it2 = it->second.indices.begin();
                it2 != it->second.indices.end();
                ++it2)
            names[*it2] = generate_unique_name(it->first);
    }

    // Generate a unique name for every empty string.
    if (template_name_duplicates.size()) {
        // At least one string ressembles to <template name>.
        for (auto it = empty_names_indices.begin();
                it != empty_names_indices.end(); ++it)
            names[*it] = generate_unique_name(template_name_);
    } else {
        // No string alike <template name> exists.
        size_t i = 0;
        for (auto it = empty_names_indices.begin();
                it != empty_names_indices.end(); ++it, ++i)
            names[*it] = format_name(template_name_, i);
    }
}